

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.cpp
# Opt level: O2

ostream * subsat::operator<<(ostream *os,Constraint *c)

{
  uint uVar1;
  Lit lit;
  bool bVar2;
  long lVar3;
  Constraint *__range1;
  
  std::operator<<(os,"{ ");
  uVar1 = c->m_size;
  bVar2 = true;
  for (lVar3 = 0; (ulong)uVar1 << 2 != lVar3; lVar3 = lVar3 + 4) {
    lit.m_index = *(index_type *)((long)&c->m_literals[0].m_index + lVar3);
    if (!bVar2) {
      std::operator<<(os,", ");
    }
    operator<<(os,lit);
    bVar2 = false;
  }
  std::operator<<(os," }");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, Constraint const& c)
{
  os << "{ ";
  bool first = true;
  for (Lit lit : c) {
    if (first) {
      first = false;
    } else {
      os << ", ";
    }
    os << lit;
  }
  os << " }";
  return os;
}